

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O1

void __thiscall
duckdb::ProcessRemainingBatchesTask::ProcessRemainingBatchesTask
          (ProcessRemainingBatchesTask *this,Executor *executor,
          shared_ptr<duckdb::Event,_true> *event_p,FixedBatchCopyGlobalState *state_p,
          ClientContext *context,PhysicalBatchCopyToFile *op)

{
  shared_ptr<duckdb::Event,_true> local_38;
  
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ExecutorTask::ExecutorTask(&this->super_ExecutorTask,executor,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ExecutorTask).super_Task._vptr_Task = (_func_int **)&PTR__ExecutorTask_024a05b8;
  this->op = op;
  this->gstate = state_p;
  this->context = context;
  return;
}

Assistant:

ProcessRemainingBatchesTask(Executor &executor, shared_ptr<Event> event_p, FixedBatchCopyGlobalState &state_p,
	                            ClientContext &context, const PhysicalBatchCopyToFile &op)
	    : ExecutorTask(executor, std::move(event_p)), op(op), gstate(state_p), context(context) {
	}